

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void check_trust_status(Terminal *term,termline *line)

{
  termline *line_local;
  Terminal *term_local;
  
  if ((line->trusted & 1U) != (term->trusted & 1U)) {
    clear_line(term,line);
    line->trusted = (_Bool)(term->trusted & 1);
  }
  return;
}

Assistant:

static void check_trust_status(Terminal *term, termline *line)
{
    if (line->trusted != term->trusted) {
        /*
         * If we're displaying trusted output on a previously
         * untrusted line, or vice versa, we need to switch the
         * 'trusted' attribute on this terminal line, and also clear
         * all its previous contents.
         */
        clear_line(term, line);
        line->trusted = term->trusted;
    }
}